

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::R_formatter<spdlog::details::null_scoped_padder>::format
          (R_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  long in_RDI;
  memory_buf_t *unaff_retaddr;
  int in_stack_0000000c;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  null_scoped_padder in_stack_ffffffffffffffd7;
  
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,5,(padding_info *)(in_RDI + 8),in_RCX);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffd7,CONCAT16(0x3a,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffc8);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 5;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
    }